

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_ctx_close(nng_ctx c)

{
  nni_ctx *local_20;
  nni_ctx *ctx;
  uint32_t local_10;
  int rv;
  nng_ctx c_local;
  
  local_10 = c.id;
  ctx._4_4_ = nni_ctx_find(&local_20,c.id);
  rv = ctx._4_4_;
  if (ctx._4_4_ == 0) {
    nni_ctx_close(local_20);
    rv = 0;
  }
  return rv;
}

Assistant:

int
nng_ctx_close(nng_ctx c)
{
	int      rv;
	nni_ctx *ctx;

	if ((rv = nni_ctx_find(&ctx, c.id)) != 0) {
		return (rv);
	}
	// no release, close releases implicitly.
	nni_ctx_close(ctx);
	return (0);
}